

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::interval_t,duckdb::interval_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThanEquals,bool>
               (interval_t *ldata,interval_t *rdata,bool *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  ulong *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  bool bVar8;
  ulong uVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  ulong uVar11;
  idx_t idx_in_entry;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_40;
  idx_t local_38;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar2 = lsel->sel_vector;
      psVar3 = rsel->sel_vector;
      uVar16 = 0;
      do {
        uVar9 = uVar16;
        if (psVar2 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar2[uVar16];
        }
        uVar11 = uVar16;
        if (psVar3 != (sel_t *)0x0) {
          uVar11 = (ulong)psVar3[uVar16];
        }
        lVar14._0_4_ = ldata[uVar9].months;
        lVar14._4_4_ = ldata[uVar9].days;
        lVar15._0_4_ = rdata[uVar11].months;
        lVar15._4_4_ = rdata[uVar11].days;
        lVar13 = (lVar15 >> 0x20) + rdata[uVar11].micros / 86400000000;
        lVar17 = lVar13 % 0x1e;
        lVar15 = (long)(int)(undefined4)lVar15 + lVar13 / 0x1e;
        lVar12 = (lVar14 >> 0x20) + ldata[uVar9].micros / 86400000000;
        lVar13 = lVar12 % 0x1e;
        lVar12 = (long)(int)(undefined4)lVar14 + lVar12 / 0x1e;
        if (lVar12 < lVar15) {
LAB_00e4a863:
          bVar8 = false;
        }
        else {
          bVar8 = true;
          if (lVar12 <= lVar15) {
            if (lVar13 < lVar17) goto LAB_00e4a863;
            bVar8 = rdata[uVar11].micros % 86400000000 <= ldata[uVar9].micros % 86400000000 ||
                    lVar17 < lVar13;
          }
        }
        result_data[uVar16] = bVar8;
        uVar16 = uVar16 + 1;
      } while (count != uVar16);
    }
  }
  else if (count != 0) {
    psVar2 = lsel->sel_vector;
    psVar3 = rsel->sel_vector;
    local_40 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar16 = 0;
    do {
      uVar9 = uVar16;
      if (psVar2 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar2[uVar16];
      }
      uVar11 = uVar16;
      if (psVar3 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar3[uVar16];
      }
      puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0)) &&
         ((puVar4 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
          puVar4 == (unsigned_long *)0x0 || ((puVar4[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0)))) {
        lVar13._0_4_ = ldata[uVar9].months;
        lVar13._4_4_ = ldata[uVar9].days;
        lVar12._0_4_ = rdata[uVar11].months;
        lVar12._4_4_ = rdata[uVar11].days;
        lVar14 = (lVar12 >> 0x20) + rdata[uVar11].micros / 86400000000;
        lVar17 = lVar14 % 0x1e;
        lVar15 = (long)(int)(undefined4)lVar12 + lVar14 / 0x1e;
        lVar14 = (lVar13 >> 0x20) + ldata[uVar9].micros / 86400000000;
        lVar12 = lVar14 % 0x1e;
        lVar13 = (long)(int)(undefined4)lVar13 + lVar14 / 0x1e;
        if (lVar13 < lVar15) {
          bVar8 = false;
        }
        else {
          bVar8 = true;
          if (lVar13 <= lVar15) {
            if (lVar12 < lVar17) {
              bVar8 = false;
            }
            else {
              bVar8 = rdata[uVar11].micros % 86400000000 <= ldata[uVar9].micros % 86400000000 ||
                      lVar17 < lVar12;
            }
          }
        }
        result_data[uVar16] = bVar8;
      }
      else {
        if ((result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var7 = p_Stack_50;
          peVar6 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar6;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var7;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_40);
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar10->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar5 = (byte)uVar16 & 0x3f;
        puVar1 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar16 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      }
      uVar16 = uVar16 + 1;
    } while (count != uVar16);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}